

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall asl::String::append(String *this,char *b,int n)

{
  char *pcVar1;
  char *s;
  int n_local;
  char *b_local;
  String *this_local;
  
  if (this->_len + n < this->_size) {
    this->_len = n + this->_len;
  }
  else {
    resize(this,this->_len + n,true,true);
  }
  pcVar1 = str(this);
  memcpy(pcVar1 + ((long)this->_len - (long)n),b,(long)n);
  pcVar1[this->_len] = '\0';
  return;
}

Assistant:

void String::append(const char* b, int n)
{
	if(_len+n >= _size)
		resize(_len+n);
	else
		_len += n;
	char* s = str();
	memcpy(s+_len-n, b, n);
	s[_len] = '\0';
}